

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_peer_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *host_list,
          int port,protocol_version v)

{
  ip_filter *this_00;
  peer_list *ppVar1;
  int iVar2;
  uint uVar3;
  torrent_peer *ptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  int __type;
  endpoint host;
  undefined1 local_70 [32];
  address local_50;
  
  if ((e->failed_ == true) &&
     (iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this), (char)iVar2 != '\0'
     )) {
    (*e->cat_->_vptr_error_category[4])(local_70,e->cat_,(ulong)(uint)e->val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"peer name lookup error: %s",CONCAT44(local_70._4_4_,local_70._0_4_));
    ::std::__cxx11::string::~string((string *)local_70);
  }
  if ((((e->failed_ == false) && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) &&
      ((host_list->
       super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
       _M_impl.super__Vector_impl_data._M_start !=
       (host_list->
       super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
       _M_impl.super__Vector_impl_data._M_finish)) &&
     (iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x11])(), (char)iVar2 == '\0')) {
    boost::asio::ip::detail::endpoint::endpoint
              (&host.impl_,
               (host_list->
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               )._M_impl.super__Vector_impl_data._M_start,(unsigned_short)port);
    this_00 = (this->m_ip_filter).
              super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (ip_filter *)0x0) {
      if (host.impl_.data_.base.sa_family != 2) {
        local_70[8] = host.impl_.data_._8_1_;
        local_70[9] = host.impl_.data_._9_1_;
        local_70[10] = host.impl_.data_._10_1_;
        local_70[0xb] = host.impl_.data_._11_1_;
        local_70[0xc] = host.impl_.data_._12_1_;
        local_70[0xd] = host.impl_.data_._13_1_;
        local_70[0xe] = host.impl_.data_._14_1_;
        local_70[0xf] = host.impl_.data_._15_1_;
        local_70._16_8_ = host.impl_.data_._16_8_;
        local_70._24_8_ = ZEXT48(host.impl_.data_.v6.sin6_scope_id);
        local_70._4_4_ = 0;
      }
      else {
        local_70._8_8_ =
             (_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              )0x0;
        local_70._16_8_ = 0;
        local_70._24_8_ = 0;
        local_70._4_4_ = host.impl_.data_.v4.sin_addr.s_addr;
      }
      local_70._0_4_ = ZEXT14(host.impl_.data_.base.sa_family != 2);
      uVar3 = ip_filter::access(this_00,local_70,__type);
      if ((uVar3 & 1) != 0) {
        iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar2 != '\0') {
          if (host.impl_.data_.base.sa_family != 2) {
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = host.impl_.data_._8_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = host.impl_.data_._9_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = host.impl_.data_._10_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = host.impl_.data_._11_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = host.impl_.data_._12_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = host.impl_.data_._13_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = host.impl_.data_._14_1_;
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = host.impl_.data_._15_1_;
            local_50.ipv6_address_.addr_.__in6_u._8_8_ = host.impl_.data_._16_8_;
            local_50.ipv6_address_.scope_id_ = (unsigned_long)host.impl_.data_.v6.sin6_scope_id;
            host.impl_.data_.v6.sin6_flowinfo = 0;
          }
          else {
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
            local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
            local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_50.ipv6_address_.scope_id_ = 0;
          }
          local_50.type_ = (anon_enum_32)(host.impl_.data_.base.sa_family != 2);
          local_50.ipv4_address_.addr_.s_addr = host.impl_.data_.v4.sin_addr.s_addr;
          boost::asio::ip::address::to_string_abi_cxx11_((string *)local_70,&local_50);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"blocked ip from tracker: %s",CONCAT44(local_70._4_4_,local_70._0_4_));
          ::std::__cxx11::string::~string((string *)local_70);
        }
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) >> 8 & 1) == 0) {
          return;
        }
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_70);
        local_50.type_ = ipv4;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_70,&host
                   ,&local_50.type_);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
        return;
      }
    }
    ptVar4 = add_peer(this,&host,(peer_source_flags_t)0x1,(pex_flags_t)((v != V2) * -0x80 + 0x80));
    if (ptVar4 != (torrent_peer *)0x0) {
      state_updated(this);
      iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar2 != '\0') {
        if (host.impl_.data_.base.sa_family != 2) {
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = host.impl_.data_._8_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = host.impl_.data_._9_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = host.impl_.data_._10_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = host.impl_.data_._11_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = host.impl_.data_._12_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = host.impl_.data_._13_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = host.impl_.data_._14_1_;
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = host.impl_.data_._15_1_;
          local_50.ipv6_address_.addr_.__in6_u._8_8_ = host.impl_.data_._16_8_;
          local_50.ipv6_address_.scope_id_ = (unsigned_long)host.impl_.data_.v6.sin6_scope_id;
          host.impl_.data_.v6.sin6_flowinfo = 0;
        }
        else {
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
          local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
          local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_50.ipv6_address_.scope_id_ = 0;
        }
        local_50.type_ = (anon_enum_32)(host.impl_.data_.base.sa_family != 2);
        local_50.ipv4_address_.addr_.s_addr = host.impl_.data_.v4.sin_addr.s_addr;
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_70,&local_50);
        ppVar1 = (this->super_torrent_hot_members).m_peer_list._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if (ppVar1 == (peer_list *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = (ulong)(uint)ppVar1->m_num_connect_candidates;
        }
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"name-lookup add_peer() [ %s ] connect-candidates: %d",
                   CONCAT44(local_70._4_4_,local_70._0_4_),uVar5);
        ::std::__cxx11::string::~string((string *)local_70);
      }
    }
    update_want_peers(this);
  }
  return;
}

Assistant:

void torrent::on_peer_name_lookup(error_code const& e
		, std::vector<address> const& host_list, int const port
		, protocol_version const v) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		COMPLETE_ASYNC("torrent::on_peer_name_lookup");

#ifndef TORRENT_DISABLE_LOGGING
		if (e && should_log())
			debug_log("peer name lookup error: %s", e.message().c_str());
#endif

		if (e || m_abort || host_list.empty() || m_ses.is_aborted()) return;

		// TODO: add one peer per IP the hostname resolves to
		tcp::endpoint host(host_list.front(), std::uint16_t(port));

		if (m_ip_filter && m_ip_filter->access(host.address()) & ip_filter::blocked)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("blocked ip from tracker: %s", host.address().to_string().c_str());
			}
#endif
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, host, peer_blocked_alert::ip_filter);
			return;
		}

		if (add_peer(host, peer_info::tracker, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0)))
		{
			state_updated();

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("name-lookup add_peer() [ %s ] connect-candidates: %d"
					, host.address().to_string().c_str()
					, m_peer_list ? m_peer_list->num_connect_candidates() : -1);
			}
#endif
		}
		update_want_peers();
	}
	catch (...) { handle_exception(); }